

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandom.cpp
# Opt level: O0

RTPRandom * jrtplib::RTPRandom::CreateDefaultRandomNumberGenerator(void)

{
  int iVar1;
  RTPRandomURandom *local_28;
  RTPRandom *rRet;
  RTPRandomURandom *r;
  
  local_28 = (RTPRandomURandom *)operator_new(0x10);
  RTPRandomURandom::RTPRandomURandom(local_28);
  iVar1 = RTPRandomURandom::Init(local_28);
  if (iVar1 < 0) {
    if (local_28 != (RTPRandomURandom *)0x0) {
      (*(local_28->super_RTPRandom)._vptr_RTPRandom[1])();
    }
    local_28 = (RTPRandomURandom *)operator_new(0x10);
    RTPRandomRand48::RTPRandomRand48((RTPRandomRand48 *)local_28);
  }
  return &local_28->super_RTPRandom;
}

Assistant:

RTPRandom *RTPRandom::CreateDefaultRandomNumberGenerator()
{
#ifdef RTP_HAVE_RAND_S
	RTPRandomRandS *r = new RTPRandomRandS();
#else
	RTPRandomURandom *r = new RTPRandomURandom();
#endif // RTP_HAVE_RAND_S
	RTPRandom *rRet = r;

	if (r->Init() < 0) // fall back to rand48
	{
		delete r;
		rRet = new RTPRandomRand48();
	}
	
	return rRet;
}